

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O3

Elf64_Verdef * __thiscall
absl::lts_20240722::debugging_internal::ElfMemImage::GetVerdef(ElfMemImage *this,int index)

{
  ushort uVar1;
  uint uVar2;
  Elf64_Verdef *pEVar3;
  char *version_definition_as_char;
  Elf64_Verdef *pEVar4;
  undefined4 in_register_00000034;
  
  if ((-1 < index) && ((ulong)(uint)index <= this->verdefnum_)) {
    pEVar4 = this->verdef_;
    uVar1 = pEVar4->vd_ndx;
    for (; ((uint)uVar1 < (uint)index && (uVar2 = pEVar4->vd_next, uVar2 != 0));
        pEVar4 = (Elf64_Verdef *)((long)&pEVar4->vd_version + (ulong)uVar2)) {
      uVar1 = *(ushort *)((long)&pEVar4->vd_ndx + (ulong)uVar2);
    }
    pEVar3 = (Elf64_Verdef *)0x0;
    if ((uint)uVar1 == index) {
      pEVar3 = pEVar4;
    }
    return pEVar3;
  }
  GetVerdef();
  return (Elf64_Verdef *)(CONCAT44(in_register_00000034,index) + 0x14);
}

Assistant:

const ElfW(Verdef) *ElfMemImage::GetVerdef(int index) const {
  ABSL_RAW_CHECK(0 <= index && static_cast<size_t>(index) <= verdefnum_,
                 "index out of range");
  const ElfW(Verdef) *version_definition = verdef_;
  while (version_definition->vd_ndx < index && version_definition->vd_next) {
    const char *const version_definition_as_char =
        reinterpret_cast<const char *>(version_definition);
    version_definition =
        reinterpret_cast<const ElfW(Verdef) *>(version_definition_as_char +
                                               version_definition->vd_next);
  }
  return version_definition->vd_ndx == index ? version_definition : nullptr;
}